

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O3

void __thiscall
testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::~ThreadLocal
          (ThreadLocal<testing::TestPartResultReporterInterface_*> *this)

{
  ValueHolderFactory *pVVar1;
  int iVar2;
  long *plVar3;
  GTestLog local_14;
  
  plVar3 = (long *)pthread_getspecific(this->key_);
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 8))(plVar3);
  }
  iVar2 = pthread_key_delete(this->key_);
  if (iVar2 != 0) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/googletest/googletest/include/gtest/internal/gtest-port.h"
                       ,0x6f4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"pthread_key_delete(key_)",0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"failed with error ",0x12);
    std::ostream::operator<<((ostream *)&std::cerr,iVar2);
    GTestLog::~GTestLog(&local_14);
  }
  pVVar1 = (this->default_factory_)._M_t.
           super___uniq_ptr_impl<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::ValueHolderFactory,_std::default_delete<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::ValueHolderFactory>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::ValueHolderFactory_*,_std::default_delete<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::ValueHolderFactory>_>
           .
           super__Head_base<0UL,_testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::ValueHolderFactory_*,_false>
           ._M_head_impl;
  if (pVVar1 != (ValueHolderFactory *)0x0) {
    (*pVVar1->_vptr_ValueHolderFactory[1])();
  }
  (this->default_factory_)._M_t.
  super___uniq_ptr_impl<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::ValueHolderFactory,_std::default_delete<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::ValueHolderFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::ValueHolderFactory_*,_std::default_delete<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::ValueHolderFactory>_>
  .
  super__Head_base<0UL,_testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::ValueHolderFactory_*,_false>
  ._M_head_impl = (ValueHolderFactory *)0x0;
  return;
}

Assistant:

~ThreadLocal() {
    // Destroys the managed object for the current thread, if any.
    DeleteThreadLocalValue(pthread_getspecific(key_));

    // Releases resources associated with the key.  This will *not*
    // delete managed objects for other threads.
    GTEST_CHECK_POSIX_SUCCESS_(pthread_key_delete(key_));
  }